

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O0

PKCS12 * d2i_PKCS12_fp(FILE *fp,PKCS12 **p12)

{
  BIO *bp;
  PKCS12 *ret;
  BIO *bio;
  PKCS12 **out_p12_local;
  FILE *fp_local;
  
  bp = BIO_new_fp(fp,0);
  if (bp == (BIO *)0x0) {
    fp_local = (FILE *)0x0;
  }
  else {
    fp_local = (FILE *)d2i_PKCS12_bio(bp,p12);
    BIO_free(bp);
  }
  return (PKCS12 *)fp_local;
}

Assistant:

PKCS12 *d2i_PKCS12_fp(FILE *fp, PKCS12 **out_p12) {
  BIO *bio;
  PKCS12 *ret;

  bio = BIO_new_fp(fp, 0 /* don't take ownership */);
  if (!bio) {
    return NULL;
  }

  ret = d2i_PKCS12_bio(bio, out_p12);
  BIO_free(bio);
  return ret;
}